

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seriot_suite.cpp
# Opt level: O1

void y_string_suite::y_string_unicode_U_plus_FDD0_nonchar(void)

{
  char input [11];
  reader reader;
  undefined4 local_18c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  char local_168 [16];
  basic_reader<char> local_158;
  
  builtin_strncpy(local_168,"[\"\\uFDD0\"]",0xb);
  local_188._M_dataplus._M_p = (pointer)strlen(local_168);
  local_188._M_string_length = (size_type)local_168;
  trial::protocol::json::basic_reader<char>::basic_reader(&local_158,(view_type *)&local_188);
  local_18c = 0xc;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xf7e,"void y_string_suite::y_string_unicode_U_plus_FDD0_nonchar()",&local_188,
             &local_18c);
  trial::protocol::json::basic_reader<char>::next(&local_158);
  local_188._M_dataplus._M_p._0_4_ = local_158.decoder.current.code;
  local_18c = 10;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xf80,"void y_string_suite::y_string_unicode_U_plus_FDD0_nonchar()",&local_188,
             &local_18c);
  trial::protocol::json::basic_reader<char>::value<std::__cxx11::string>(&local_188,&local_158);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[4]>
            ("reader.value<std::string>()","\"\\xEF\\xB7\\x90\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xf81,"void y_string_suite::y_string_unicode_U_plus_FDD0_nonchar()",&local_188,
             anon_var_dwarf_57e4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  trial::protocol::json::basic_reader<char>::next(&local_158);
  local_18c = 0xd;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xf83,"void y_string_suite::y_string_unicode_U_plus_FDD0_nonchar()",&local_188,
             &local_18c);
  trial::protocol::json::basic_reader<char>::next(&local_158);
  local_188._M_dataplus._M_p._0_4_ = local_158.decoder.current.code;
  local_18c = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xf85,"void y_string_suite::y_string_unicode_U_plus_FDD0_nonchar()",&local_188,
             &local_18c);
  if (local_158.stack.c.
      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.stack.c.
                    super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_158.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void y_string_unicode_U_plus_FDD0_nonchar()
{
    const char input[] = "[\"\\uFDD0\"]";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_array);
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::string);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<std::string>(), "\xEF\xB7\x90");
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end_array);
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end);
}